

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall
CLI::FileError::FileError(FileError *this,string *ename,string *msg,ExitCodes exit_code)

{
  undefined4 in_ECX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  ParseError *in_RSI;
  undefined8 *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  ExitCodes in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ename_00;
  
  ename_00 = in_RDX;
  ::std::__cxx11::string::string(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  ::std::__cxx11::string::string(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  ParseError::ParseError
            (in_RSI,ename_00,(string *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffdc);
  ::std::__cxx11::string::~string(in_RDX);
  ::std::__cxx11::string::~string(in_RDX);
  *in_RDI = &PTR__FileError_00a5c6c0;
  return;
}

Assistant:

static FileError Missing(std::string name) { return FileError(name + " was not readable (missing?)"); }